

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnModuleCommand(CommandRunner *this,ModuleCommand *command)

{
  uint32_t uVar1;
  FILE *file;
  bool bVar2;
  undefined8 uVar3;
  Trap *this_00;
  ulong uVar4;
  mapped_type *this_01;
  Ptr *out_trap;
  string local_f8;
  size_t local_d8;
  undefined1 local_d0 [8];
  Ptr instance;
  Ptr trap;
  RefVec imports;
  string local_80;
  string_view local_60;
  undefined1 local_50 [8];
  Ptr module;
  Errors errors;
  ModuleCommand *command_local;
  CommandRunner *this_local;
  
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module.root_index_);
  local_60 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&command->filename);
  ReadModule((Ptr *)local_50,this,local_60,(Errors *)&module.root_index_);
  file = _stderr;
  std::__cxx11::string::string((string *)&local_80);
  out_trap = (Ptr *)0x0;
  wabt::FormatErrorsToFile
            ((Errors *)&module.root_index_,Binary,(LexerSourceLineFinder *)0x0,file,&local_80,Never,
             0x50);
  std::__cxx11::string::~string((string *)&local_80);
  bVar2 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)local_50);
  if (bVar2) {
    bVar2 = ValidIR(&command->filename);
    if (bVar2) {
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
                ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&trap.root_index_)
      ;
      PopulateImports(this,(Ptr *)local_50,(RefVec *)&trap.root_index_);
      wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr
                ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
      local_d8 = (size_t)wabt::interp::RefPtr<wabt::interp::Module>::ref
                                   ((RefPtr<wabt::interp::Module> *)local_50);
      wabt::interp::Instance::Instantiate
                ((Ptr *)local_d0,(Instance *)this,(Store *)local_d8,(Ref)&trap.root_index_,
                 (RefVec *)&instance.root_index_,out_trap);
      bVar2 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)&instance.root_index_);
      if (bVar2) {
        bVar2 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)local_d0);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!instance",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/spectest-interp.cc"
                        ,0x663,
                        "wabt::Result spectest::CommandRunner::OnModuleCommand(const ModuleCommand *)"
                       );
        }
        uVar1 = (command->super_CommandMixin<(wabt::CommandType)0>).super_Command.line;
        this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                            ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
        wabt::interp::Trap::message_abi_cxx11_(&local_f8,this_00);
        uVar3 = std::__cxx11::string::c_str();
        PrintError(this,uVar1,"error instantiating module: \"%s\"",uVar3);
        std::__cxx11::string::~string((string *)&local_f8);
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        PopulateExports(this,(Ptr *)local_d0,&this->last_instance_);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
                    ::operator[](&this->instances_,&command->name);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
          ::operator=(this_01,&this->last_instance_);
        }
        wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr
                ((RefPtr<wabt::interp::Instance> *)local_d0);
      wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr
                ((RefPtr<wabt::interp::Trap> *)&instance.root_index_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector
                ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&trap.root_index_)
      ;
    }
    else {
      uVar1 = (command->super_CommandMixin<(wabt::CommandType)0>).super_Command.line;
      uVar3 = std::__cxx11::string::c_str();
      PrintError(this,uVar1,"IR Validator thinks module is invalid: \"%s\"",uVar3);
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    uVar1 = (command->super_CommandMixin<(wabt::CommandType)0>).super_Command.line;
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,uVar1,"error reading module: \"%s\"",uVar3);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_50);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module.root_index_);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnModuleCommand(const ModuleCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);
  FormatErrorsToFile(errors, Location::Type::Binary);

  if (!module) {
    PrintError(command->line, "error reading module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  if (!ValidIR(command->filename)) {
    PrintError(command->line, "IR Validator thinks module is invalid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (trap) {
    assert(!instance);
    PrintError(command->line, "error instantiating module: \"%s\"",
               trap->message().c_str());
    return wabt::Result::Error;
  }

  PopulateExports(instance, &last_instance_);
  if (!command->name.empty()) {
    instances_[command->name] = last_instance_;
  }

  return wabt::Result::Ok;
}